

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::tuple_caster<std::pair,unsigned_long,long>::
       cast_impl<std::pair<unsigned_long,long>,0ul,1ul>
                 (undefined8 param_1,undefined1 param_2,undefined8 param_3)

{
  bool bVar1;
  PyObject **ppPVar2;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_2UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range3;
  array<pybind11::object,_2UL> entries;
  undefined7 in_stack_fffffffffffffed8;
  return_value_policy in_stack_fffffffffffffedf;
  unsigned_long in_stack_fffffffffffffee0;
  handle in_stack_fffffffffffffee8;
  PyTypeObject *pPVar3;
  handle in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  tuple *in_stack_ffffffffffffff00;
  handle local_d0;
  iterator local_c8;
  iterator local_c0;
  iterator local_b8;
  undefined1 *local_b0;
  int local_a4;
  handle local_a0;
  undefined4 local_94;
  handle *local_90;
  handle *local_88;
  handle *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  PyObject *local_68;
  undefined8 local_50;
  PyObject *local_48;
  undefined1 *local_40;
  undefined1 local_38 [8];
  undefined1 auStack_30 [15];
  undefined1 local_21;
  undefined8 local_20;
  undefined8 local_10;
  handle local_8;
  
  local_40 = local_38;
  local_21 = param_2;
  local_20 = param_1;
  local_10 = param_3;
  std::get<0ul,unsigned_long,long>((pair<unsigned_long,_long> *)0x3eeef3);
  local_50 = local_10;
  local_48 = (PyObject *)
             type_caster<unsigned_long,_void>::cast<unsigned_long>
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffedf,
                        in_stack_fffffffffffffee8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffee8);
  local_40 = auStack_30;
  std::get<1ul,unsigned_long,long>((pair<unsigned_long,_long> *)0x3eef66);
  local_70 = local_10;
  local_68 = (PyObject *)
             type_caster<long,_void>::cast<long>
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffedf,
                        in_stack_fffffffffffffee8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffee8);
  local_78 = local_38;
  local_80 = &std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)0x3eefd3)->
              super_handle;
  local_88 = &std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)0x3eefe8)->
              super_handle;
  do {
    if (local_80 == local_88) {
      pybind11::tuple::tuple(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_a4 = 0;
      local_b0 = local_38;
      local_b8 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)0x3ef10c);
      local_c0 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)0x3ef11b);
      for (; local_b8 != local_c0; local_b8 = local_b8 + 1) {
        local_c8 = local_b8;
        in_stack_fffffffffffffef0 =
             object::release((object *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8)
                            );
        local_d0 = in_stack_fffffffffffffef0;
        ppPVar2 = pybind11::handle::ptr(&local_d0);
        pPVar3 = (PyTypeObject *)*ppPVar2;
        ppPVar2 = pybind11::handle::ptr(&local_a0);
        (&(*ppPVar2)[1].ob_type)[local_a4] = pPVar3;
        local_a4 = local_a4 + 1;
      }
      local_8 = object::release((object *)
                                CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      local_94 = 1;
      pybind11::tuple::~tuple((tuple *)0x3ef21c);
LAB_003ef21c:
      std::array<pybind11::object,_2UL>::~array
                ((array<pybind11::object,_2UL> *)in_stack_fffffffffffffef0.m_ptr);
      return (handle)local_8.m_ptr;
    }
    local_90 = local_80;
    bVar1 = pybind11::handle::operator_cast_to_bool(local_80);
    if (!bVar1) {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
      local_94 = 1;
      goto LAB_003ef21c;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }